

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O0

void pbrt::RGBColorSpace::Init(Allocator alloc)

{
  undefined8 in_stack_fffffffffffffe78;
  undefined1 *puVar1;
  Point2<float> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe98;
  RGBColorSpace *name;
  SpectrumHandle *in_stack_fffffffffffffea0;
  SpectrumHandle *args_3;
  Point2<float> *in_stack_fffffffffffffea8;
  RGBColorSpace *args_2;
  allocator<char> *in_stack_fffffffffffffeb0;
  allocator<char> *__a;
  Point2<float> *in_stack_fffffffffffffeb8;
  RGBColorSpace *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_131;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffed0;
  undefined8 local_e9;
  allocator<char> local_a1;
  string local_a0 [87];
  undefined1 local_49 [65];
  undefined1 local_8 [8];
  
  Point2<float>::Point2
            (in_stack_fffffffffffffe80,(float)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (float)in_stack_fffffffffffffe78);
  Point2<float>::Point2
            (in_stack_fffffffffffffe80,(float)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (float)in_stack_fffffffffffffe78);
  Point2<float>::Point2
            (in_stack_fffffffffffffe80,(float)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (float)in_stack_fffffffffffffe78);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  GetNamedSpectrum(in_stack_fffffffffffffe98);
  puVar1 = local_8;
  sRGB = pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                   ((polymorphic_allocator<std::byte> *)this,in_stack_fffffffffffffeb8,
                    (Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                    in_stack_fffffffffffffea0,(RGBToSpectrumTable **)in_stack_fffffffffffffe98,
                    in_stack_fffffffffffffed0);
  args = sRGB;
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  __a = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)args,__a);
  GetNamedSpectrum(in_stack_fffffffffffffe98);
  puVar1 = local_8;
  DCI_P3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this,&args->r,(Point2<float> *)__a,
                      in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                      (RGBToSpectrumTable **)in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  args_2 = DCI_P3;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  args_3 = (SpectrumHandle *)&local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)args,__a);
  GetNamedSpectrum(in_stack_fffffffffffffe98);
  puVar1 = local_8;
  Rec2020 = pstd::pmr::polymorphic_allocator<std::byte>::
            new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      ((polymorphic_allocator<std::byte> *)this,&args->r,(Point2<float> *)__a,
                       &args_2->r,args_3,(RGBToSpectrumTable **)in_stack_fffffffffffffe98,
                       in_stack_fffffffffffffed0);
  name = Rec2020;
  std::__cxx11::string::~string((string *)((long)&local_e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  Point2<float>::Point2(in_stack_fffffffffffffe80,(float)((ulong)puVar1 >> 0x20),SUB84(puVar1,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)args,__a);
  GetNamedSpectrum((string *)name);
  ACES2065_1 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         ((polymorphic_allocator<std::byte> *)this,&args->r,(Point2<float> *)__a,
                          &args_2->r,args_3,(RGBToSpectrumTable **)name,in_stack_fffffffffffffed0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

void RGBColorSpace::Init(Allocator alloc) {
    // Rec. ITU-R BT.709.3
    sRGB = alloc.new_object<RGBColorSpace>(
        Point2f(.64, .33), Point2f(.3, .6), Point2f(.15, .06),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::sRGB, alloc);
    // P3-D65 (display)
    DCI_P3 = alloc.new_object<RGBColorSpace>(
        Point2f(.68, .32), Point2f(.265, .690), Point2f(.15, .06),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::DCI_P3, alloc);
    // ITU-R Rec BT.2020
    Rec2020 = alloc.new_object<RGBColorSpace>(
        Point2f(.708, .292), Point2f(.170, .797), Point2f(.131, .046),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::Rec2020, alloc);
    ACES2065_1 = alloc.new_object<RGBColorSpace>(
        Point2f(.7347, .2653), Point2f(0., 1.), Point2f(.0001, -.077),
        GetNamedSpectrum("illum-acesD60"), RGBToSpectrumTable::ACES2065_1, alloc);
#ifdef PBRT_BUILD_GPU_RENDERER
    if (Options->useGPU) {
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_sRGB, &RGBColorSpace::sRGB,
                                      sizeof(RGBColorSpace_sRGB)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_DCI_P3, &RGBColorSpace::DCI_P3,
                                      sizeof(RGBColorSpace_DCI_P3)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_Rec2020, &RGBColorSpace::Rec2020,
                                      sizeof(RGBColorSpace_Rec2020)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_ACES2065_1,
                                      &RGBColorSpace::ACES2065_1,
                                      sizeof(RGBColorSpace_ACES2065_1)));
    }
#endif
}